

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

Io_MvMan_t * Io_MvAlloc(void)

{
  Io_MvMan_t *__s;
  Vec_Ptr_t *pVVar1;
  Vec_Str_t *pVVar2;
  Io_MvMan_t *p;
  
  __s = (Io_MvMan_t *)malloc(0x260);
  memset(__s,0,0x260);
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vLines = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vModels = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vTokens = pVVar1;
  pVVar1 = Vec_PtrAlloc(0x200);
  __s->vTokens2 = pVVar1;
  pVVar2 = Vec_StrAlloc(0x200);
  __s->vFunc = pVVar2;
  return __s;
}

Assistant:

static Io_MvMan_t * Io_MvAlloc()
{
    Io_MvMan_t * p;
    p = ABC_ALLOC( Io_MvMan_t, 1 );
    memset( p, 0, sizeof(Io_MvMan_t) );
    p->vLines   = Vec_PtrAlloc( 512 );
    p->vModels  = Vec_PtrAlloc( 512 );
    p->vTokens  = Vec_PtrAlloc( 512 );
    p->vTokens2 = Vec_PtrAlloc( 512 );
    p->vFunc    = Vec_StrAlloc( 512 );
    return p;
}